

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O1

void dill_mark_branch_location(dill_stream_conflict s,int label)

{
  int iVar1;
  private_ctx pdVar2;
  char *pcVar3;
  char *pcVar4;
  branch_location *pbVar5;
  
  pdVar2 = s->p;
  pcVar3 = pdVar2->code_base;
  pcVar4 = pdVar2->cur_ip;
  iVar1 = (pdVar2->branch_table).branch_alloc;
  if ((pdVar2->branch_table).branch_count == iVar1) {
    (pdVar2->branch_table).branch_alloc = iVar1 + 1;
    pbVar5 = (branch_location *)dill_realloc((pdVar2->branch_table).branch_locs,(long)iVar1 * 8 + 8)
    ;
    (pdVar2->branch_table).branch_locs = pbVar5;
  }
  pbVar5 = (pdVar2->branch_table).branch_locs;
  iVar1 = (pdVar2->branch_table).branch_count;
  pbVar5[iVar1].label = label;
  pbVar5[iVar1].loc = (int)pcVar4 - (int)pcVar3;
  (pdVar2->branch_table).branch_count = iVar1 + 1;
  return;
}

Assistant:

extern void
dill_mark_branch_location(dill_stream s, int label)
{
    struct branch_table* t = &s->p->branch_table;
    int branch_loc = (int)((char*)s->p->cur_ip - (char*)s->p->code_base);

    if (t->branch_count == t->branch_alloc) {
        t->branch_alloc++;
        t->branch_locs = realloc(
            t->branch_locs, sizeof(struct branch_location) * t->branch_alloc);
    }
    t->branch_locs[t->branch_count].label = label;
    t->branch_locs[t->branch_count].loc = branch_loc;
    t->branch_count++;
}